

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

char * get_attack_noun(CHAR_DATA *ch,int dt)

{
  int iVar1;
  const_reference pvVar2;
  int in_ESI;
  CHAR_DATA *in_RDI;
  char *attack;
  int tmp_dt;
  OBJ_DATA *wield;
  char *local_28;
  int local_1c;
  OBJ_DATA *local_18;
  
  if (in_ESI == gsn_dual_wield) {
    local_18 = get_eq_char(in_RDI,0x12);
  }
  else {
    local_18 = get_eq_char(in_RDI,0x10);
  }
  if (local_18 == (OBJ_DATA *)0x0) {
    iVar1 = (int)in_RDI->dam_type;
  }
  else {
    iVar1 = local_18->value[3];
  }
  local_1c = iVar1 + 1000;
  if ((local_1c < 0x3e9) || (0x425 < local_1c)) {
    pvVar2 = std::vector<attack_type,_std::allocator<attack_type>_>::operator[](&attack_table,0x11);
    local_28 = pvVar2->noun;
  }
  else {
    pvVar2 = std::vector<attack_type,_std::allocator<attack_type>_>::operator[]
                       (&attack_table,(long)iVar1);
    local_28 = pvVar2->noun;
  }
  return local_28;
}

Assistant:

char *get_attack_noun(CHAR_DATA *ch, int dt)
{
	OBJ_DATA *wield;
	int tmp_dt;
	char *attack;

	/*
	if(is_shifted(ch))
	{
		if(!attack_lookup(form_table[ch->pcdata->shifted].attack_type))
			return "Error";

		return attack_table[attack_lookup(form_table[ch->pcdata->shifted].attack_type)].noun;
	}
	*/

	tmp_dt = TYPE_HIT;

	if (dt == gsn_dual_wield)
		wield = get_eq_char(ch, WEAR_DUAL_WIELD);
	else
		wield = get_eq_char(ch, WEAR_WIELD);

	if (wield != nullptr)
		tmp_dt += wield->value[3];
	else
		tmp_dt += ch->dam_type;

	if (tmp_dt > TYPE_HIT && tmp_dt < TYPE_HIT + MAX_DAMAGE_MESSAGE)
		attack = attack_table[tmp_dt - TYPE_HIT].noun;
	else
		attack = attack_table[17].noun;

	return attack;
}